

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuThreadUtil.cpp
# Opt level: O3

void __thiscall
tcu::ThreadUtil::DataBlock::DataBlock(DataBlock *this,SharedPtr<tcu::ThreadUtil::Event> *event)

{
  deInt32 *pdVar1;
  Event *pEVar2;
  SharedPtrStateBase *pSVar3;
  
  pEVar2 = event->m_ptr;
  pSVar3 = event->m_state;
  if (pSVar3 == (SharedPtrStateBase *)0x0) {
    (this->super_Object).m_type = "DataBlock";
    (this->super_Object).m_modify.m_ptr = pEVar2;
    (this->super_Object).m_modify.m_state = (SharedPtrStateBase *)0x0;
    (this->super_Object).m_reads.
    super__Vector_base<de::SharedPtr<tcu::ThreadUtil::Event>,_std::allocator<de::SharedPtr<tcu::ThreadUtil::Event>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (this->super_Object).m_reads.
    super__Vector_base<de::SharedPtr<tcu::ThreadUtil::Event>,_std::allocator<de::SharedPtr<tcu::ThreadUtil::Event>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (this->super_Object).m_reads.
    super__Vector_base<de::SharedPtr<tcu::ThreadUtil::Event>,_std::allocator<de::SharedPtr<tcu::ThreadUtil::Event>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  }
  else {
    LOCK();
    pSVar3->strongRefCount = pSVar3->strongRefCount + 1;
    UNLOCK();
    LOCK();
    pSVar3->weakRefCount = pSVar3->weakRefCount + 1;
    UNLOCK();
    (this->super_Object)._vptr_Object = (_func_int **)&PTR__Object_0218cca8;
    (this->super_Object).m_type = "DataBlock";
    (this->super_Object).m_modify.m_ptr = pEVar2;
    (this->super_Object).m_modify.m_state = pSVar3;
    LOCK();
    pSVar3->strongRefCount = pSVar3->strongRefCount + 1;
    UNLOCK();
    LOCK();
    pdVar1 = &((this->super_Object).m_modify.m_state)->weakRefCount;
    *pdVar1 = *pdVar1 + 1;
    UNLOCK();
    (this->super_Object).m_reads.
    super__Vector_base<de::SharedPtr<tcu::ThreadUtil::Event>,_std::allocator<de::SharedPtr<tcu::ThreadUtil::Event>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (this->super_Object).m_reads.
    super__Vector_base<de::SharedPtr<tcu::ThreadUtil::Event>,_std::allocator<de::SharedPtr<tcu::ThreadUtil::Event>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (this->super_Object).m_reads.
    super__Vector_base<de::SharedPtr<tcu::ThreadUtil::Event>,_std::allocator<de::SharedPtr<tcu::ThreadUtil::Event>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    LOCK();
    pdVar1 = &pSVar3->strongRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      (*pSVar3->_vptr_SharedPtrStateBase[2])(pSVar3);
    }
    LOCK();
    pdVar1 = &pSVar3->weakRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      (*pSVar3->_vptr_SharedPtrStateBase[1])(pSVar3);
    }
  }
  (this->super_Object)._vptr_Object = (_func_int **)&PTR__DataBlock_0218cdb0;
  (this->m_data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  return;
}

Assistant:

DataBlock::DataBlock (SharedPtr<Event> event)
	: Object("DataBlock", event)
{
}